

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Multiple::_Run(_Test_Multiple *this)

{
  leveldb local_5a8 [32];
  Tester local_588;
  int local_3e8 [2];
  Tester local_3e0;
  SequenceNumber local_240;
  int local_234;
  Tester local_230;
  Slice local_90;
  Slice local_80;
  Slice local_70;
  Slice local_60 [2];
  Slice local_40;
  undefined1 local_30 [8];
  WriteBatch batch;
  _Test_Multiple *this_local;
  
  batch._24_8_ = this;
  WriteBatch::WriteBatch((WriteBatch *)local_30);
  Slice::Slice(&local_40,"foo");
  Slice::Slice(local_60,"bar");
  WriteBatch::Put((WriteBatch *)local_30,&local_40,local_60);
  Slice::Slice(&local_70,"box");
  WriteBatch::Delete((WriteBatch *)local_30,&local_70);
  Slice::Slice(&local_80,"baz");
  Slice::Slice(&local_90,"boo");
  WriteBatch::Put((WriteBatch *)local_30,&local_80,&local_90);
  WriteBatchInternal::SetSequence((WriteBatch *)local_30,100);
  test::Tester::Tester
            (&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x45);
  local_234 = 100;
  local_240 = WriteBatchInternal::Sequence((WriteBatch *)local_30);
  test::Tester::IsEq<int,unsigned_long>(&local_230,&local_234,&local_240);
  test::Tester::~Tester(&local_230);
  test::Tester::Tester
            (&local_3e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x46);
  local_3e8[1] = 3;
  local_3e8[0] = WriteBatchInternal::Count((WriteBatch *)local_30);
  test::Tester::IsEq<int,int>(&local_3e0,local_3e8 + 1,local_3e8);
  test::Tester::~Tester(&local_3e0);
  test::Tester::Tester
            (&local_588,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x4b);
  PrintContents_abi_cxx11_(local_5a8,(WriteBatch *)local_30);
  test::Tester::IsEq<char[50],std::__cxx11::string>
            (&local_588,(char (*) [50])"Put(baz, boo)@102Delete(box)@101Put(foo, bar)@100",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8);
  std::__cxx11::string::~string((string *)local_5a8);
  test::Tester::~Tester(&local_588);
  WriteBatch::~WriteBatch((WriteBatch *)local_30);
  return;
}

Assistant:

TEST(WriteBatchTest, Multiple) {
  WriteBatch batch;
  batch.Put(Slice("foo"), Slice("bar"));
  batch.Delete(Slice("box"));
  batch.Put(Slice("baz"), Slice("boo"));
  WriteBatchInternal::SetSequence(&batch, 100);
  ASSERT_EQ(100, WriteBatchInternal::Sequence(&batch));
  ASSERT_EQ(3, WriteBatchInternal::Count(&batch));
  ASSERT_EQ(
      "Put(baz, boo)@102"
      "Delete(box)@101"
      "Put(foo, bar)@100",
      PrintContents(&batch));
}